

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Var * __thiscall
kratos::Generator::var
          (Generator *this,string *var_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  allocator<const_kratos::IRNode_*> *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  uint32_t uVar2;
  element_type *peVar3;
  bool *pbVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__args_3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar5 [16];
  format_args args;
  string_view format_str;
  Generator *local_158;
  undefined1 local_150 [8];
  shared_ptr<kratos::Var> p;
  IRNode *local_138;
  iterator local_130;
  size_type local_128;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_120;
  string local_108;
  undefined1 local_d8 [8];
  shared_ptr<kratos::Var> v_p;
  _Self local_c0;
  byte local_b1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_b0;
  bool is_signed_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *size_local;
  undefined1 auStack_a0 [4];
  uint32_t width_local;
  string *var_name_local;
  Generator *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  undefined1 local_50 [8];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_b1 = is_signed;
  pvStack_b0 = size;
  size_local._4_4_ = width;
  _auStack_a0 = var_name;
  var_name_local = (string *)this;
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::find(&this->vars_,var_name);
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::end(&this->vars_);
  bVar1 = std::operator!=(&local_c0,
                          (_Self *)&v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
  if (!bVar1) {
    __args_3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&size_local + 4);
    local_158 = this;
    std::
    make_shared<kratos::Var,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool&>
              ((Generator **)local_150,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_158,
               (uint *)_auStack_a0,__args_3,(bool *)pvStack_b0);
    std::
    map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>&>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
                *)&this->vars_,(void *)_auStack_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
               (shared_ptr<kratos::Var> *)__args_3);
    this_local = (Generator *)
                 std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_150);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_150);
    return (Var *)this_local;
  }
  get_var((Generator *)local_d8,(string *)this);
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_d8);
  uVar2 = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
  if (uVar2 == size_local._4_4_) {
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_d8);
    pbVar4 = Var::is_signed(peVar3);
    if ((*pbVar4 & 1U) == (local_b1 & 1)) {
      this_local = (Generator *)
                   std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_d8);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_d8);
      return (Var *)this_local;
    }
  }
  p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
  auVar5 = __cxa_allocate_exception(0x10);
  local_38 = &local_108;
  local_40 = "redefinition of {0} with different width/sign";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)_auStack_a0;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[46],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"redefinition of {0} with different width/sign",(v7 *)_auStack_a0,auVar5._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "redefinition of {0} with different width/sign");
  local_50 = (undefined1  [8])&local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_30._8_8_ = &local_88;
  local_30._M_allocated_capacity = (size_type)local_50;
  local_20 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
              *)local_50;
  local_10 = (anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
              *)local_50;
  local_18 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)local_30._8_8_;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_30._8_8_,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_50);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_88.field_1.values_;
  format_str.size_ = local_88.desc_;
  format_str.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_108,(detail *)local_78.data_,format_str,args);
  local_138 = &std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_d8)->
               super_IRNode;
  local_130 = &local_138;
  local_128 = 1;
  this_00 = (allocator<const_kratos::IRNode_*> *)
            ((long)&p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            + 7);
  std::allocator<const_kratos::IRNode_*>::allocator(this_00);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_120,__l,this_00);
  VarException::VarException(auVar5._0_8_,&local_108,&local_120);
  p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
  __cxa_throw(auVar5._0_8_,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, const std::vector<uint32_t> &size,
                    bool is_signed) {
    if (vars_.find(var_name) != vars_.end()) {
        auto v_p = get_var(var_name);
        if (v_p->width() != width || v_p->is_signed() != is_signed)
            throw VarException(::format("redefinition of {0} with different width/sign", var_name),
                               {v_p.get()});
        return *v_p;
    }
    auto p = std::make_shared<Var>(this, var_name, width, size, is_signed);
    vars_.emplace(var_name, p);
    return *p;
}